

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::custom_layer_to_index(Net *this,char *type)

{
  int iVar1;
  size_t i;
  long lVar2;
  pointer pcVar3;
  long lVar4;
  
  pcVar3 = (this->d->custom_layer_registry).
           super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->d->custom_layer_registry).
                super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3;
  lVar2 = 0;
  while( true ) {
    if (lVar4 >> 5 == lVar2) {
      return -1;
    }
    iVar1 = strcmp(type,pcVar3->name);
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
    pcVar3 = pcVar3 + 1;
  }
  return (int)lVar2;
}

Assistant:

int Net::custom_layer_to_index(const char* type)
{
    const size_t custom_layer_registry_entry_count = d->custom_layer_registry.size();
    for (size_t i = 0; i < custom_layer_registry_entry_count; i++)
    {
        if (strcmp(type, d->custom_layer_registry[i].name) == 0)
            return static_cast<int>(i);
    }

    return -1;
}